

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_optimizations.cpp
# Opt level: O1

void __thiscall
duckdb::RegexOptimizationRule::RegexOptimizationRule
          (RegexOptimizationRule *this,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::FunctionMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var3;
  _Head_base<0UL,_duckdb::FunctionMatcher_*,_false> _Var4;
  pointer pFVar5;
  templated_unique_single_t func;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_40;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_38;
  FunctionMatcher local_30;
  FunctionMatcher local_28;
  FunctionMatcher FStack_20;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_019aa668;
  local_40._M_head_impl = (ExpressionMatcher *)operator_new(0x48);
  (local_40._M_head_impl)->expr_class = BOUND_FUNCTION;
  ((local_40._M_head_impl)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)0x0;
  ((local_40._M_head_impl)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = (TypeMatcher *)0x0;
  (local_40._M_head_impl)->_vptr_ExpressionMatcher =
       (_func_int **)&PTR__FunctionExpressionMatcher_019cb118;
  local_40._M_head_impl[1]._vptr_ExpressionMatcher = (_func_int **)0x0;
  *(undefined8 *)&local_40._M_head_impl[1].expr_class = 0;
  local_40._M_head_impl[1].expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)0x0;
  local_40._M_head_impl[2]._vptr_ExpressionMatcher = (_func_int **)0x0;
  _Var4._M_head_impl = (FunctionMatcher *)operator_new(0x28);
  local_38._M_head_impl = (ExpressionMatcher *)&local_28;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"regexp_matches","");
  (_Var4._M_head_impl)->_vptr_FunctionMatcher = (_func_int **)&PTR__SpecificFunctionMatcher_019aa9f8
  ;
  _Var4._M_head_impl[1]._vptr_FunctionMatcher = (_func_int **)(_Var4._M_head_impl + 3);
  if (local_38._M_head_impl == (ExpressionMatcher *)&local_28) {
    _Var4._M_head_impl[3] = (FunctionMatcher)local_28._vptr_FunctionMatcher;
    _Var4._M_head_impl[4]._vptr_FunctionMatcher = FStack_20._vptr_FunctionMatcher;
  }
  else {
    _Var4._M_head_impl[1]._vptr_FunctionMatcher = (_func_int **)local_38._M_head_impl;
    _Var4._M_head_impl[3]._vptr_FunctionMatcher = local_28._vptr_FunctionMatcher;
  }
  _Var4._M_head_impl[2]._vptr_FunctionMatcher = local_30._vptr_FunctionMatcher;
  pFVar5 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_40);
  _Var1._M_head_impl =
       (pFVar5->function).
       super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>
       .super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl;
  (pFVar5->function).
  super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>.
  super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (FunctionMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_FunctionMatcher[1])();
  }
  pFVar5 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_40);
  pFVar5->policy = SOME_ORDERED;
  pFVar5 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_40);
  local_38._M_head_impl = (ExpressionMatcher *)operator_new(0x20);
  (local_38._M_head_impl)->_vptr_ExpressionMatcher = (_func_int **)&PTR__ExpressionMatcher_019caf60;
  (local_38._M_head_impl)->expr_class = INVALID;
  ((local_38._M_head_impl)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>)0x0;
  ((local_38._M_head_impl)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::TypeMatcher_*,_false>)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pFVar5->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_38);
  if (local_38._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_38._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  pFVar5 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_40);
  local_38._M_head_impl = (ExpressionMatcher *)operator_new(0x20);
  (local_38._M_head_impl)->expr_class = BOUND_CONSTANT;
  ((local_38._M_head_impl)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>)0x0;
  ((local_38._M_head_impl)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::TypeMatcher_*,_false>)0x0;
  (local_38._M_head_impl)->_vptr_ExpressionMatcher = (_func_int **)&PTR__ExpressionMatcher_019aa8d8;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pFVar5->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_38);
  if (local_38._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_38._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  _Var3._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ExpressionMatcher *)0x0;
  _Var2._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var2._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_ExpressionMatcher + 8))();
  }
  if (local_40._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_40._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  return;
}

Assistant:

RegexOptimizationRule::RegexOptimizationRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	auto func = make_uniq<FunctionExpressionMatcher>();
	func->function = make_uniq<SpecificFunctionMatcher>("regexp_matches");
	func->policy = SetMatcher::Policy::SOME_ORDERED;
	func->matchers.push_back(make_uniq<ExpressionMatcher>());
	func->matchers.push_back(make_uniq<ConstantExpressionMatcher>());

	root = std::move(func);
}